

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract_provider.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::provider::AbstractProvider::ContinuouslyConnectLoop(AbstractProvider *this)

{
  undefined1 in_AL;
  undefined7 in_register_00000001;
  duration<long,_std::ratio<1L,_1L>_> local_28;
  
  local_28.__r = CONCAT71(in_register_00000001,in_AL);
  while ((this->run_state_)._M_i == RUNNING) {
    CreateConnection(this);
    if ((this->run_state_)._M_i == RUNNING) {
      spdlog::logger::info<>(Log,"will reconnect in 10 seconds");
      local_28.__r = 10;
      std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&local_28);
    }
  }
  return;
}

Assistant:

void AbstractProvider::ContinuouslyConnectLoop()
{
    while (IsRunning())
    {
        CreateConnection();
        if (IsRunning())
        {
            Log->info("will reconnect in 10 seconds");
            std::this_thread::sleep_for(std::chrono::seconds(10));
        }
    }
}